

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O3

Span<char> __thiscall absl::lts_20240722::CordBuffer::Rep::long_available(Rep *this)

{
  byte bVar1;
  CordRepFlat *pCVar2;
  size_t sVar3;
  sbyte sVar4;
  sbyte sVar5;
  int iVar6;
  int iVar7;
  Span<char> SVar8;
  
  if (((this->field_0).short_rep.raw_size & 1U) == 0) {
    pCVar2 = (this->field_0).long_rep.rep;
    sVar3 = (pCVar2->super_CordRep).length;
    SVar8.ptr_ = (pCVar2->super_CordRep).storage + sVar3;
    bVar1 = (pCVar2->super_CordRep).tag;
    sVar5 = 0xc;
    if (bVar1 < 0xbb) {
      sVar5 = 6;
    }
    iVar7 = -0xb800d;
    if (bVar1 < 0xbb) {
      iVar7 = -0xe8d;
    }
    sVar4 = 3;
    if (0x42 < bVar1) {
      sVar4 = sVar5;
    }
    iVar6 = -0x1d;
    if (0x42 < bVar1) {
      iVar6 = iVar7;
    }
    SVar8.len_ = (long)(int)(((uint)bVar1 << sVar4) + iVar6) - sVar3;
    return SVar8;
  }
  __assert_fail("!is_short()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord_buffer.h"
                ,0x153,"absl::Span<char> absl::CordBuffer::Rep::long_available() const");
}

Assistant:

bool is_short() const {
      constexpr size_t offset = offsetof(Short, raw_size);
      return (reinterpret_cast<const char*>(this)[offset] & 1) != 0;
    }